

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O2

object_kind * lookup_kind(wchar_t tval,wchar_t sval)

{
  ulong uVar1;
  char *pcVar2;
  object_kind *poVar3;
  bool bVar4;
  
  uVar1 = (ulong)z_info->k_max;
  poVar3 = k_info;
  while( true ) {
    bVar4 = uVar1 == 0;
    uVar1 = uVar1 - 1;
    if (bVar4) {
      pcVar2 = tval_find_name(tval);
      msg("No object: %d:%d (%s)",tval,sval,pcVar2);
      return (object_kind *)0x0;
    }
    if ((poVar3->tval == tval) && (poVar3->sval == sval)) break;
    poVar3 = poVar3 + 1;
  }
  return poVar3;
}

Assistant:

struct object_kind *lookup_kind(int tval, int sval)
{
	int k;

	/* Look for it */
	for (k = 0; k < z_info->k_max; k++) {
		struct object_kind *kind = &k_info[k];
		if (kind->tval == tval && kind->sval == sval)
			return kind;
	}

	/* Failure */
	msg("No object: %d:%d (%s)", tval, sval, tval_find_name(tval));
	return NULL;
}